

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Exception *
capnp::_::anon_unknown_18::toException(Exception *__return_storage_ptr__,Reader *exception)

{
  CapTableReader *pCVar1;
  PointerType PVar2;
  char *pcVar3;
  uchar *__dest;
  Type type;
  SegmentReader *pSVar4;
  ElementCount index;
  size_t sVar5;
  uchar *puVar6;
  size_t __n;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Reader RVar9;
  Reader RVar10;
  Exception *result;
  String reason;
  String result_2;
  Array<unsigned_char> result_3;
  String local_108;
  ElementCount local_ec;
  StructReader local_e8;
  Array<unsigned_char> local_b8;
  WirePointer local_a0;
  PointerReader local_98;
  ListReader local_78;
  String local_48;
  
  if ((exception->_reader).pointerCount == 0) {
    local_78.elementCount = 0x7fffffff;
    local_78.capTable = (CapTableReader *)0x0;
    local_78.ptr = (byte *)0x0;
    local_78.segment = (SegmentReader *)0x0;
  }
  else {
    local_78.segment = (exception->_reader).segment;
    local_78.capTable = (exception->_reader).capTable;
    local_78.ptr = (byte *)(exception->_reader).pointers;
    local_78.elementCount = (exception->_reader).nestingLimit;
  }
  RVar9 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_78,(void *)0x0,0);
  pcVar3 = RVar9.super_StringPtr.content.ptr;
  if ((RVar9.super_StringPtr.content.size_ - 1 < 0x12) ||
     (auVar7[0] = -(*pcVar3 == 'r'), auVar7[1] = -(pcVar3[1] == 'e'),
     auVar7[2] = -(pcVar3[2] == 'm'), auVar7[3] = -(pcVar3[3] == 'o'),
     auVar7[4] = -(pcVar3[4] == 't'), auVar7[5] = -(pcVar3[5] == 'e'),
     auVar7[6] = -(pcVar3[6] == ' '), auVar7[7] = -(pcVar3[7] == 'e'),
     auVar7[8] = -(pcVar3[8] == 'x'), auVar7[9] = -(pcVar3[9] == 'c'),
     auVar7[10] = -(pcVar3[10] == 'e'), auVar7[0xb] = -(pcVar3[0xb] == 'p'),
     auVar7[0xc] = -(pcVar3[0xc] == 't'), auVar7[0xd] = -(pcVar3[0xd] == 'i'),
     auVar7[0xe] = -(pcVar3[0xe] == 'o'), auVar7[0xf] = -(pcVar3[0xf] == 'n'),
     auVar8[0] = -((char)*(undefined2 *)(pcVar3 + 0x10) == ':'),
     auVar8[1] = -((char)((ushort)*(undefined2 *)(pcVar3 + 0x10) >> 8) == ' '), auVar8[2] = 0xff,
     auVar8[3] = 0xff, auVar8[4] = 0xff, auVar8[5] = 0xff, auVar8[6] = 0xff, auVar8[7] = 0xff,
     auVar8[8] = 0xff, auVar8[9] = 0xff, auVar8[10] = 0xff, auVar8[0xb] = 0xff, auVar8[0xc] = 0xff,
     auVar8[0xd] = 0xff, auVar8[0xe] = 0xff, auVar8[0xf] = 0xff, auVar8 = auVar8 & auVar7,
     (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff)) {
    if ((exception->_reader).pointerCount == 0) {
      local_78.elementCount = 0x7fffffff;
      local_78.capTable = (CapTableReader *)0x0;
      local_78.ptr = (byte *)0x0;
      local_78.segment = (SegmentReader *)0x0;
    }
    else {
      local_78.segment = (exception->_reader).segment;
      local_78.capTable = (exception->_reader).capTable;
      local_78.ptr = (byte *)(exception->_reader).pointers;
      local_78.elementCount = (exception->_reader).nestingLimit;
    }
    RVar9 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_78,(void *)0x0,0);
    local_e8.segment = RVar9.super_StringPtr.content.ptr;
    local_78.segment = (SegmentReader *)0x5823de;
    local_78.capTable = (CapTableReader *)0x12;
    local_e8.capTable = (CapTableReader *)(RVar9.super_StringPtr.content.size_ - 1);
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_108,(_ *)&local_78,(ArrayPtr<const_char> *)&local_e8,
               (ArrayPtr<const_char> *)&local_e8);
  }
  else {
    if ((exception->_reader).pointerCount == 0) {
      local_78.elementCount = 0x7fffffff;
      local_78.capTable = (CapTableReader *)0x0;
      local_78.ptr = (byte *)0x0;
      local_78.segment = (SegmentReader *)0x0;
    }
    else {
      local_78.segment = (exception->_reader).segment;
      local_78.capTable = (exception->_reader).capTable;
      local_78.ptr = (byte *)(exception->_reader).pointers;
      local_78.elementCount = (exception->_reader).nestingLimit;
    }
    RVar9 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_78,(void *)0x0,0);
    kj::heapString(&local_108,RVar9.super_StringPtr.content.size_ - 1);
    __n = RVar9.super_StringPtr.content.size_ - 1;
    if (__n != 0) {
      pcVar3 = (char *)local_108.content.size_;
      if ((char *)local_108.content.size_ != (char *)0x0) {
        pcVar3 = local_108.content.ptr;
      }
      memcpy(pcVar3,RVar9.super_StringPtr.content.ptr,__n);
    }
  }
  type = FAILED;
  if (0x2f < (exception->_reader).dataSize) {
    type = (Type)*(ushort *)((long)(exception->_reader).data + 4);
  }
  local_48.content.ptr = local_108.content.ptr;
  local_48.content.size_ = local_108.content.size_;
  local_48.content.disposer = local_108.content.disposer;
  local_108.content.ptr = (char *)0x0;
  local_108.content.size_ = 0;
  kj::Exception::Exception(__return_storage_ptr__,type,"(remote)",0,&local_48);
  sVar5 = local_48.content.size_;
  pcVar3 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar3,1,sVar5,sVar5,0);
  }
  if ((exception->_reader).pointerCount < 2) {
    local_78.segment = (SegmentReader *)0x0;
    local_78.capTable = (CapTableReader *)0x0;
    local_78.ptr = (byte *)0x0;
    local_78.elementCount = 0x7fffffff;
  }
  else {
    local_78.segment = (exception->_reader).segment;
    local_78.capTable = (exception->_reader).capTable;
    local_78.ptr = (byte *)((exception->_reader).pointers + 1);
    local_78.elementCount = (exception->_reader).nestingLimit;
  }
  PVar2 = PointerReader::getPointerType((PointerReader *)&local_78);
  if (PVar2 != NULL_) {
    if ((exception->_reader).pointerCount < 2) {
      local_78.elementCount = 0x7fffffff;
      local_78.capTable = (CapTableReader *)0x0;
      local_78.ptr = (byte *)0x0;
      local_78.segment = (SegmentReader *)0x0;
    }
    else {
      local_78.segment = (exception->_reader).segment;
      local_78.capTable = (exception->_reader).capTable;
      local_78.ptr = (byte *)((exception->_reader).pointers + 1);
      local_78.elementCount = (exception->_reader).nestingLimit;
    }
    RVar9 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_78,(void *)0x0,0);
    sVar5 = RVar9.super_StringPtr.content.size_ - 1;
    kj::heapString((String *)&local_e8,sVar5);
    if (sVar5 != 0) {
      pSVar4 = (SegmentReader *)local_e8.capTable;
      if ((SegmentReader *)local_e8.capTable != (SegmentReader *)0x0) {
        pSVar4 = local_e8.segment;
      }
      memcpy(pSVar4,RVar9.super_StringPtr.content.ptr,sVar5);
    }
    kj::Exception::setRemoteTrace(__return_storage_ptr__,(String *)&local_e8);
    pCVar1 = local_e8.capTable;
    pSVar4 = local_e8.segment;
    if (local_e8.segment != (SegmentReader *)0x0) {
      local_e8.segment = (SegmentReader *)0x0;
      local_e8.capTable = (CapTableReader *)0x0;
      (*(code *)**local_e8.data)(local_e8.data,pSVar4,1,pCVar1,pCVar1,0);
    }
  }
  if ((exception->_reader).pointerCount < 3) {
    local_e8.pointers._0_4_ = 0x7fffffff;
    local_e8.capTable = (CapTableReader *)0x0;
    local_e8.data = (WirePointer *)0x0;
    local_e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_e8.segment = (exception->_reader).segment;
    local_e8.capTable = (exception->_reader).capTable;
    local_e8.data = (exception->_reader).pointers + 2;
    local_e8.pointers._0_4_ = (exception->_reader).nestingLimit;
  }
  PointerReader::getList(&local_78,(PointerReader *)&local_e8,INLINE_COMPOSITE,(word *)0x0);
  local_ec = local_78.elementCount;
  if (local_78.elementCount != 0) {
    index = 0;
    do {
      ListReader::getStructElement(&local_e8,&local_78,index);
      if (local_e8.pointerCount == 0) {
        local_98.segment = (SegmentReader *)0x0;
        local_98.capTable = (CapTableReader *)0x0;
        local_98.pointer = (WirePointer *)0x0;
        local_98.nestingLimit = 0x7fffffff;
      }
      else {
        local_98.pointer = (WirePointer *)CONCAT44(local_e8.pointers._4_4_,(int)local_e8.pointers);
        local_98.segment = local_e8.segment;
        local_98.capTable = local_e8.capTable;
        local_98.nestingLimit = local_e8.nestingLimit;
      }
      PVar2 = PointerReader::getPointerType(&local_98);
      if (PVar2 != NULL_) {
        if (local_e8.dataSize < 0x40) {
          local_a0.offsetAndKind.value = 0;
          local_a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          local_a0 = *local_e8.data;
        }
        if (local_e8.pointerCount == 0) {
          local_98.nestingLimit = 0x7fffffff;
          local_98.capTable = (CapTableReader *)0x0;
          local_98.pointer = (WirePointer *)0x0;
          local_98.segment = (SegmentReader *)0x0;
        }
        else {
          local_98.pointer = (WirePointer *)CONCAT44(local_e8.pointers._4_4_,(int)local_e8.pointers)
          ;
          local_98.capTable = local_e8.capTable;
          local_98.segment = local_e8.segment;
          local_98.nestingLimit = local_e8.nestingLimit;
        }
        RVar10 = PointerReader::getBlob<capnp::Data>(&local_98,(void *)0x0,0);
        sVar5 = RVar10.super_ArrayPtr<const_unsigned_char>.size_;
        __dest = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                    (1,0,sVar5,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                                    );
        puVar6 = __dest;
        if (sVar5 != 0) {
          puVar6 = __dest + sVar5;
          memcpy(__dest,RVar10.super_ArrayPtr<const_unsigned_char>.ptr,sVar5);
        }
        local_b8.size_ = (long)puVar6 - (long)__dest;
        local_b8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        local_b8.ptr = __dest;
        kj::Exception::setDetail(__return_storage_ptr__,(DetailTypeId)local_a0,&local_b8);
        sVar5 = local_b8.size_;
        puVar6 = local_b8.ptr;
        if (local_b8.ptr != (uchar *)0x0) {
          local_b8.ptr = (uchar *)0x0;
          local_b8.size_ = 0;
          (**(local_b8.disposer)->_vptr_ArrayDisposer)(local_b8.disposer,puVar6,1,sVar5,sVar5,0);
        }
      }
      index = index + 1;
    } while (local_ec != index);
  }
  sVar5 = local_108.content.size_;
  pcVar3 = local_108.content.ptr;
  if (local_108.content.ptr != (char *)0x0) {
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    (**(local_108.content.disposer)->_vptr_ArrayDisposer)
              (local_108.content.disposer,pcVar3,1,sVar5,sVar5,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Exception toException(const rpc::Exception::Reader& exception) {
  auto reason = [&]() {
    if (exception.getReason().startsWith("remote exception: ")) {
      return kj::str(exception.getReason());
    } else {
      return kj::str("remote exception: ", exception.getReason());
    }
  }();

  kj::Exception result(static_cast<kj::Exception::Type>(exception.getType()),
      "(remote)", 0, kj::mv(reason));
  if (exception.hasTrace()) {
    result.setRemoteTrace(kj::str(exception.getTrace()));
  }
  for (auto detail : exception.getDetails()) {
    if (detail.hasData()) {
      result.setDetail(detail.getDetailId(), kj::heapArray(detail.getData()));
    }
  }
  return result;
}